

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void __thiscall Image_GetSetBGR_Test::TestBody(Image_GetSetBGR_Test *this)

{
  PixelFormat format;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Allocator alloc;
  float *pfVar4;
  int c;
  int c_00;
  long lVar5;
  char *pcVar6;
  float *pfVar7;
  ColorEncodingHandle *encoding;
  long lVar8;
  long lVar9;
  int x;
  ulong uVar10;
  long *plVar11;
  undefined1 auVar12 [16];
  Float FVar13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  AssertionResult gtest_ar_1;
  ImageChannelValues rgb;
  AssertionResult gtest_ar_;
  Float qv;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageChannelDesc bgrDesc;
  Image image;
  AssertHelper local_2b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  AssertHelper local_298;
  undefined1 local_290 [16];
  undefined1 local_280 [8];
  float local_278 [2];
  undefined1 *local_270;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  undefined1 local_260 [16];
  long *local_250 [2];
  long local_240 [2];
  undefined1 **local_230;
  undefined1 **local_228;
  long local_220;
  Tuple2<pbrt::Point2,_int> local_218;
  undefined1 local_210 [20];
  float local_1fc;
  float local_1f8 [2];
  size_t local_1f0;
  size_t local_1e8;
  PixelFormat local_1e0;
  Float local_1dc;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1d8;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  ulong local_1a0;
  ulong local_198;
  ColorEncodingHandle local_190;
  PixelFormat local_184 [3];
  ImageChannelDesc local_178;
  Image local_148;
  
  GetFloatPixels(&local_1d8,(Point2i)0x2000000007,3);
  local_184[0] = U256;
  local_184[1] = Half;
  local_184[2] = 2;
  local_228 = &local_270;
  lVar8 = 0;
  local_230 = &local_270;
  do {
    local_1b8 = lVar8;
    format = *(PixelFormat *)((long)local_184 + lVar8);
    local_290._0_8_ = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"R","");
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"G","");
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"B","");
    local_190.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_190;
    channels.n = 3;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290;
    pbrt::Image::Image(&local_148,format,(Point2i)0x2000000007,channels,encoding,alloc);
    lVar8 = -0x60;
    plVar11 = local_240;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
    lVar9 = 0;
    lVar8 = 0;
    local_1e0 = format;
    do {
      uVar10 = 0;
      local_220 = lVar8;
      local_218 = (Tuple2<pbrt::Point2,_int>)lVar9;
      do {
        lVar5 = 0;
        do {
          pbrt::Image::SetChannel
                    (&local_148,(Point2i)(lVar8 << 0x20 | uVar10),(int)lVar5,
                     *(Float *)((long)local_1d8.ptr + lVar5 * 4 + lVar9));
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0xc;
      } while (uVar10 != 7);
      lVar8 = local_220 + 1;
      lVar9 = (long)local_218 + 0x54;
    } while (lVar8 != 0x20);
    local_290._0_8_ = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"B","");
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"G","");
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"R","");
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290;
    pbrt::Image::GetChannelDesc(&local_178,&local_148,requestedChannels);
    lVar8 = -0x60;
    plVar11 = local_240;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
    local_210[0] = (internal)(local_178.offset.nStored != 0);
    local_210._8_8_ = (float *)0x0;
    if (!(bool)local_210[0]) {
      testing::Message::Message((Message *)&local_2a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_290,(internal *)local_210,(AssertionResult *)"bool(bgrDesc)",
                 "false","true",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0xc0,(char *)local_290._0_8_);
      testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2a8);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      if ((undefined1 *)local_290._0_8_ != local_280) {
        operator_delete((void *)local_290._0_8_,(long)local_280 + 1);
      }
      if (local_2a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_2a8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_2a8.ptr_ + 8))();
        }
        local_2a8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_210 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar8 = 0;
    lVar9 = 0;
    do {
      local_1a0 = lVar9 << 0x20;
      uVar10 = 0;
      local_220 = lVar8;
      local_1b0 = lVar9;
      local_1a8 = lVar8;
      do {
        local_218 = (Tuple2<pbrt::Point2,_int>)(local_1a0 | uVar10);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)local_290,&local_148,(Point2i)local_218,
                   (WrapMode2D)0x200000002);
        local_2b0.data_._0_4_ = 4.2039e-45;
        local_2a8.ptr_ = local_268;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_210,"3","rgb.size()",(int *)&local_2b0,
                   (unsigned_long *)&local_2a8);
        if (local_210[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2a8);
          pcVar6 = "";
          if ((float *)local_210._8_8_ != (float *)0x0) {
            pcVar6 = *(char **)local_210._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xc5,pcVar6);
          testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2a8);
          testing::internal::AssertHelper::~AssertHelper(&local_2b0);
          if (local_2a8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_2a8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_2a8.ptr_ + 8))();
            }
            local_2a8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_210 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)local_210,&local_148,(Point2i)local_218,&local_178,
                   (WrapMode2D)0x200000002);
        pfVar4 = (float *)local_290._8_8_;
        if ((float *)local_290._8_8_ == (float *)0x0) {
          pfVar4 = (float *)local_280;
        }
        pfVar7 = (float *)(local_210._8_8_ + 8);
        if ((float *)local_210._8_8_ == (float *)0x0) {
          pfVar7 = local_1f8;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_2a8,"rgb[0]","bgr[2]",pfVar4,pfVar7);
        if (local_2a8.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2b0);
          pcVar6 = "";
          if (local_2a0.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_298,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,200,pcVar6);
          testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_298);
          if (local_2b0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_2b0.data_ + 8))();
            }
            local_2b0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_2a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        pfVar4 = (float *)(local_290._8_8_ + 4);
        if ((float *)local_290._8_8_ == (float *)0x0) {
          pfVar4 = (float *)(local_280 + 4);
        }
        pfVar7 = (float *)(local_210._8_8_ + 4);
        if ((float *)local_210._8_8_ == (float *)0x0) {
          pfVar7 = &local_1fc;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_2a8,"rgb[1]","bgr[1]",pfVar4,pfVar7);
        if (local_2a8.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2b0);
          pcVar6 = "";
          if (local_2a0.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_298,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xc9,pcVar6);
          testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_298);
          if (local_2b0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_2b0.data_ + 8))();
            }
            local_2b0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_2a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        pfVar4 = (float *)(local_290._8_8_ + 8);
        if ((float *)local_290._8_8_ == (float *)0x0) {
          pfVar4 = local_278;
        }
        pfVar7 = (float *)local_210._8_8_;
        if ((float *)local_210._8_8_ == (float *)0x0) {
          pfVar7 = (float *)(local_210 + 0x10);
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_2a8,"rgb[2]","bgr[0]",pfVar4,pfVar7);
        if (local_2a8.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2b0);
          pcVar6 = "";
          if (local_2a0.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_298,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xca,pcVar6);
          testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_298);
          if (local_2b0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_2b0.data_ + 8))();
            }
            local_2b0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_2a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        lVar9 = 0;
        c_00 = 0;
        lVar8 = local_220;
        local_198 = uVar10;
        do {
          pfVar4 = (float *)local_290._8_8_;
          FVar13 = pbrt::Image::GetChannel
                             (&local_148,(Point2i)local_218,c_00,(WrapMode2D)0x200000002);
          if (pfVar4 == (float *)0x0) {
            pfVar4 = (float *)local_280;
          }
          local_2b0.data_._0_4_ = FVar13;
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)&local_2a8,"rgb[c]","image.GetChannel({x, y}, c)",
                     (float *)((long)pfVar4 + lVar9),(float *)&local_2b0);
          if (local_2a8.ptr_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_2b0);
            pcVar6 = "";
            if (local_2a0.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_298,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0xcd,pcVar6);
            testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
            testing::internal::AssertHelper::~AssertHelper(&local_298);
            if (local_2b0.data_ != (AssertHelperData *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_2b0.data_ + 8))();
              }
              local_2b0.data_ = (AssertHelperData *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_2a0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_1e0 == U256) {
            pfVar4 = (float *)local_290._8_8_;
            if ((float *)local_290._8_8_ == (float *)0x0) {
              pfVar4 = (float *)local_280;
            }
            auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                 ZEXT416(*(uint *)((long)local_1d8.ptr + lVar8)));
            uVar1 = vcmpss_avx512f(ZEXT416(*(uint *)((long)local_1d8.ptr + lVar8)),
                                   ZEXT816(0) << 0x40,1);
            auVar2._8_4_ = 0x7fffffff;
            auVar2._0_8_ = 0x7fffffff7fffffff;
            auVar2._12_4_ = 0x7fffffff;
            auVar12 = vandps_avx512vl(ZEXT416((uint)(*(float *)((long)pfVar4 + lVar9) -
                                                    (float)((uint)!(bool)((byte)uVar1 & 1) *
                                                           auVar12._0_4_))),auVar2);
            local_2b0.data_._0_4_ = (Float)auVar12._0_4_;
            local_298.data_._0_4_ = 0x3b00c24b;
            testing::internal::CmpHelperLT<float,float>
                      ((internal *)&local_2a8,"std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1))",
                       "0.501f / 255.f",(float *)&local_2b0,(float *)&local_298);
            if (local_2a8.ptr_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_2b0);
              pcVar6 = "";
              if (local_2a0.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_298,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xd1,pcVar6);
              testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
              testing::internal::AssertHelper::~AssertHelper(&local_298);
              if (local_2b0.data_ != (AssertHelperData *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_2b0.data_ + 8))();
                }
                local_2b0.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_2a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            local_1dc = modelQuantization(*(Float *)((long)local_1d8.ptr + lVar8),local_1e0);
            pfVar4 = (float *)local_290._8_8_;
            if ((float *)local_290._8_8_ == (float *)0x0) {
              pfVar4 = (float *)local_280;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_2a8,"rgb[c]","qv",(float *)((long)pfVar4 + lVar9),
                       &local_1dc);
            if (local_2a8.ptr_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_2b0);
              pcVar6 = "";
              if (local_2a0.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((local_2a0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_298,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xd4,pcVar6);
              testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2b0);
              testing::internal::AssertHelper::~AssertHelper(&local_298);
              if (local_2b0.data_ != (AssertHelperData *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (local_2b0.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_2b0.data_ + 8))();
                }
                local_2b0.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_2a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          lVar8 = lVar8 + 4;
          c_00 = c_00 + 1;
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0xc);
        local_1e8 = 0;
        (**(code **)(*(long *)CONCAT71(local_210._1_7_,local_210[0]) + 0x18))
                  ((long *)CONCAT71(local_210._1_7_,local_210[0]),local_210._8_8_,local_1f0 << 2,4);
        local_268 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        (**(code **)(*(long *)local_290._0_8_ + 0x18))
                  (local_290._0_8_,local_290._8_8_,(long)local_270 << 2,4);
        uVar10 = local_198 + 1;
        local_220 = local_220 + 0xc;
      } while (uVar10 != 7);
      lVar9 = local_1b0 + 1;
      lVar8 = local_1a8 + 0x54;
    } while (lVar9 != 0x20);
    local_178.offset.nStored = 0;
    (*(local_178.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_178.offset.alloc.memoryResource,local_178.offset.ptr,
               local_178.offset.nAlloc << 2,4);
    local_148.p32.nStored = 0;
    (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
    local_148.p16.nStored = 0;
    (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
    local_148.p8.nStored = 0;
    (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_148.channelNames);
    lVar8 = local_1b8 + 4;
  } while (lVar8 != 0xc);
  local_1d8.nStored = 0;
  (*(local_1d8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_1d8.alloc.memoryResource,local_1d8.ptr,local_1d8.nAlloc << 2,4);
  return;
}

Assistant:

TEST(Image, GetSetBGR) {
    Point2i res(7, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x)
                for (int c = 0; c < 3; ++c)
                    image.SetChannel({x, y}, c, rgbPixels[3 * y * res[0] + 3 * x + c]);

        ImageChannelDesc bgrDesc = image.GetChannelDesc({"B", "G", "R"});
        EXPECT_TRUE(bool(bgrDesc));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues rgb = image.GetChannels({x, y});
                EXPECT_EQ(3, rgb.size());

                ImageChannelValues bgr = image.GetChannels({x, y}, bgrDesc);
                EXPECT_EQ(rgb[0], bgr[2]);
                EXPECT_EQ(rgb[1], bgr[1]);
                EXPECT_EQ(rgb[2], bgr[0]);

                for (int c = 0; c < 3; ++c) {
                    EXPECT_EQ(rgb[c], image.GetChannel({x, y}, c));
                    int offset = 3 * y * res[0] + 3 * x + c;
                    if (format == PixelFormat::U256)
                        EXPECT_LT(std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1)),
                                  0.501f / 255.f);
                    else {
                        Float qv = modelQuantization(rgbPixels[offset], format);
                        EXPECT_EQ(rgb[c], qv);
                    }
                }
            }
    }
}